

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

_Bool mtrap_menu(void)

{
  _func_void_menu_ptr_conflict **menu_00;
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  void *data;
  ui_event uVar4;
  ui_event_type local_140;
  _Bool basic_skipped;
  trap_kind_conflict *choice;
  size_t num;
  size_t count;
  size_t i;
  ui_event evt;
  region area;
  menu_iter menu_f;
  menu menu;
  
  memcpy(&area.width,&PTR_mtrap_tag_002f3868,0x28);
  evt._4_8_ = 0x10000000f;
  area.col = L'0';
  area.row = L'\xffffffff';
  evt.type = EVT_NONE;
  num = 0;
  bVar1 = false;
  _Var2 = flag_has_dbg((player->state).pflags,10,0x4d,"player->state.pflags","(PF_EXTRA_TRAP)");
  if (_Var2) {
    iVar3 = (int)player->lev / 4;
  }
  else {
    iVar3 = (int)player->lev / 6;
  }
  choice = (trap_kind_conflict *)(long)(iVar3 + 1);
  data = mem_zalloc((long)choice * 0x88);
  for (count = 0; count < z_info->trap_max; count = count + 1) {
    _Var2 = flag_has_dbg(trap_info[count].flags,3,0x10,"trap_info[i].flags","TRF_M_TRAP");
    if (_Var2) {
      if (bVar1) {
        memcpy((void *)((long)data + num * 0x88),trap_info + count,0x88);
        num = num + 1;
        goto LAB_00226c8a;
      }
      bVar1 = true;
    }
    else {
LAB_00226c8a:
      if ((trap_kind_conflict *)num == choice) break;
    }
  }
  area.row = iVar3 + L'\x03';
  if (choice == (trap_kind_conflict *)0x0) {
    mem_free(data);
    menu._175_1_ = 0;
  }
  else {
    screen_save();
    menu_00 = &menu_f.resize;
    menu_init((menu_conflict *)menu_00,MN_SKIN_SCROLL,(menu_iter *)&area.width);
    menu_setpriv((menu_conflict *)menu_00,iVar3 + 1,data);
    region_erase_bordered((region_conflict *)&evt.mouse.x);
    menu_layout((menu_conflict *)menu_00,(region_conflict *)&evt.mouse.x);
    prt("",evt._8_4_ + L'\x01',evt.key.code);
    uVar4 = menu_select((menu_conflict *)menu_00,0,true);
    local_140 = CONCAT31(local_140._1_3_,uVar4.key.mods);
    evt.type = local_140;
    mem_free(data);
    screen_load();
    i._4_4_ = uVar4.type;
    menu._175_1_ = i._4_4_ != EVT_ESCAPE;
  }
  return (_Bool)menu._175_1_;
}

Assistant:

static bool mtrap_menu(void)
{
	struct menu menu;
	menu_iter menu_f = { mtrap_tag, 0, mtrap_display, mtrap_action, 0 };
	region area = { 15, 1, 48, -1 };
	ui_event evt = { 0 };

	size_t i, count = 0, num = 0;

	struct trap_kind *choice;
	bool basic_skipped = false;

	/* See how many traps available */
	if (player_has(player, PF_EXTRA_TRAP)) {
		num = 1 + (player->lev / 4);
	} else {
		num = 1 + (player->lev / 6);
	}

	/* Create the array */
	choice = mem_zalloc(num * sizeof(struct trap_kind));

	/* Pick out the monster traps in order */
	for (i = 0; i < z_info->trap_max; i++) {
		if (trf_has(trap_info[i].flags, TRF_M_TRAP)) {
			if (!basic_skipped) {
				basic_skipped = true;
				continue;
			}
			memcpy(&choice[count++], &trap_info[i], sizeof(struct trap_kind));
		}
		if (count == num) break; 
	}

	/* Clear space */
	area.page_rows = num + 2;

	/* Return here if there are no traps */
	if (!num) {
		mem_free(choice);
		return false;
	}


	/* Save the screen and clear it */
	screen_save();

	/* Set up the menu */
	menu_init(&menu, MN_SKIN_SCROLL, &menu_f);
	menu.title = "Choose an advanced monster trap (ESC to cancel):";
	menu_setpriv(&menu, num, choice);
	menu.browse_hook = mtrap_menu_browser;
	menu.flags = MN_DBL_TAP;
	region_erase_bordered(&area);
	menu_layout(&menu, &area);
	prt("", area.row + 1, area.col);

	/* Select an entry */
	evt = menu_select(&menu, 0, true);

	/* Free memory */
	mem_free(choice);

	/* Load screen */
	screen_load();
	return (evt.type != EVT_ESCAPE);
}